

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O2

bool __thiscall Dinic::levels(Dinic *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pvVar3;
  int *piVar4;
  pointer piVar5;
  pointer pEVar6;
  int *piVar7;
  int iVar8;
  initializer_list<int> __l;
  undefined1 local_d8 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> bfs;
  int b;
  int local_38;
  allocator_type local_31;
  
  piVar2 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar1 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (piVar5 = piVar1; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    *piVar5 = -1;
  }
  piVar1[this->S] = 0;
  local_38 = this->S;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)
             &bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,__l,&local_31);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_d8,
             (_Deque_base<int,_std::allocator<int>_> *)
             &bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  while (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
         _M_node !=
         (_Map_pointer)
         bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_map_size) {
    iVar8 = *(int *)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map_size;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)local_d8);
    if (iVar8 == this->T) goto LAB_0012752c;
    pvVar3 = (this->g).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = *(pointer *)
              ((long)&pvVar3[iVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (piVar7 = pvVar3[iVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar7 != piVar4; piVar7 = piVar7 + 1) {
      pEVar6 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._0_4_ = pEVar6[*piVar7].b;
      piVar1 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((piVar1[(int)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node] == -1) &&
         (pEVar6 = pEVar6 + *piVar7, pEVar6->cap != pEVar6->flow)) {
        piVar1[(int)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node] = piVar1[iVar8] + 1;
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)local_d8,
                   (value_type_conflict *)
                   &bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node);
      }
    }
  }
  iVar8 = this->T;
LAB_0012752c:
  iVar8 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar8];
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_d8);
  return iVar8 != -1;
}

Assistant:

bool levels() {
        fill(d.begin(), d.end(), -1);
        d[S] = 0;
        queue<int> bfs({S});
        while (!bfs.empty()) {
            int a = bfs.front();
            bfs.pop();
            if (a == T) break;
            for (auto x : g[a]) {
                int b = e[x].b;
                if (d[b] != -1 || e[x].unused() == 0) continue;
                d[b] = d[a] + 1;
                bfs.push(b);
            }
        }
        return d[T] != -1;
    }